

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::Read(VirtualMachine *this)

{
  istream *piVar1;
  element_type *peVar2;
  char cVar3;
  anon_union_8_6_52c89740_for_Variable_1 aVar4;
  Variable v;
  size_type *local_40;
  string read;
  
  read._M_dataplus._M_p = (pointer)0x0;
  read._M_string_length._0_1_ = 0;
  piVar1 = this->in;
  local_40 = &read._M_string_length;
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar1,(string *)&local_40,cVar3);
  aVar4.stringValue = Heap::NewString_abi_cxx11_(&this->heap);
  std::__cxx11::string::_M_assign((string *)aVar4.objectValue);
  v.field_1.integerValue = aVar4.integerValue;
  v._0_8_ = 4;
  pushOpStack(this,v);
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  if (local_40 != &read._M_string_length) {
    operator_delete(local_40,CONCAT71(read._M_string_length._1_7_,(undefined1)read._M_string_length)
                             + 1);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::Read() {
  std::string read;
  std::getline(this->in, read);
  auto ret = this->heap.NewString();
  ret->assign(read);
  this->pushString(ret);
  this->advance();
}